

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huffman.c
# Opt level: O1

uint32_t BrotliBuildHuffmanTable
                   (HuffmanCode *root_table,int root_bits,uint16_t *symbol_lists,uint16_t *count)

{
  long lVar1;
  uint16_t *puVar2;
  byte *pbVar3;
  byte bVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  uint32_t uVar12;
  int iVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  HuffmanCode *pHVar19;
  long lVar20;
  uint32_t uVar21;
  uint32_t local_70;
  uint local_6c;
  ulong local_50;
  
  lVar14 = -1;
  do {
    lVar20 = lVar14;
    lVar14 = lVar20 + -1;
  } while (symbol_lists[lVar20] == 0xffff);
  bVar6 = (byte)root_bits;
  local_70 = 1 << (bVar6 & 0x1f);
  iVar15 = (int)(lVar20 + 0x10);
  uVar21 = 1 << ((byte)(lVar20 + 0x10) & 0x1f);
  iVar18 = iVar15;
  if (root_bits <= iVar15) {
    uVar21 = local_70;
    iVar18 = root_bits;
  }
  iVar8 = 2;
  uVar10 = 0x80;
  lVar20 = 0;
  lVar14 = 1;
  do {
    uVar16 = (uint)count[lVar14];
    if (count[lVar14] != 0) {
      uVar17 = (uint)lVar14 - 0x10;
      do {
        uVar17 = (uint)symbol_lists[(int)uVar17];
        bVar4 = ""[lVar20];
        uVar12 = uVar21;
        do {
          iVar13 = uVar12 - iVar8;
          uVar12 = uVar12 - iVar8;
          root_table[(ulong)bVar4 + (long)iVar13] = (HuffmanCode)(uVar17 << 0x10 | (uint)lVar14);
        } while (0 < (int)uVar12);
        lVar20 = lVar20 + uVar10;
        uVar16 = uVar16 - 1;
      } while (uVar16 != 0);
    }
    iVar8 = iVar8 * 2;
    uVar10 = uVar10 >> 1;
    bVar5 = lVar14 < iVar18;
    lVar14 = lVar14 + 1;
  } while (bVar5);
  for (; local_70 != uVar21; uVar21 = uVar21 * 2) {
    memcpy(root_table + (int)uVar21,root_table,(long)(int)uVar21 * 4);
  }
  local_50 = 0x80;
  if (root_bits < iVar15) {
    local_6c = root_bits + 1;
    lVar11 = 0x100;
    iVar18 = 2;
    lVar14 = (long)root_bits;
    pHVar19 = root_table;
    do {
      lVar1 = lVar14 + 1;
      if (count[lVar14 + 1] != 0) {
        uVar16 = (uint)lVar1 - root_bits;
        uVar17 = (int)lVar14 - 0xf;
        do {
          if (lVar11 == 0x100) {
            lVar11 = lVar14;
            iVar8 = 1 << ((byte)uVar16 & 0x1f);
            uVar7 = local_6c;
            uVar9 = (uint)lVar1;
            if (lVar14 < 0xe) {
              do {
                iVar13 = iVar8 - (uint)count[lVar11 + 1];
                uVar9 = uVar7;
                if (iVar13 == 0 || iVar8 < (int)(uint)count[lVar11 + 1]) goto LAB_00107719;
                lVar11 = lVar11 + 1;
                iVar8 = iVar13 * 2;
                uVar7 = uVar7 + 1;
              } while (lVar11 < 0xe);
              uVar9 = 0xf;
            }
LAB_00107719:
            pHVar19 = pHVar19 + (int)uVar21;
            uVar21 = 1 << ((char)uVar9 - bVar6 & 0x1f);
            local_70 = local_70 + uVar21;
            pbVar3 = "" + lVar20;
            lVar20 = lVar20 + (0x80UL >> (bVar6 - 1 & 0x3f));
            root_table[*pbVar3] =
                 (HuffmanCode)
                 (uVar9 & 0xff |
                 (((uint)((int)pHVar19 - (int)root_table) >> 2) - (uint)*pbVar3) * 0x10000);
            lVar11 = 0;
          }
          uVar17 = (uint)symbol_lists[(int)uVar17];
          bVar4 = ""[lVar11];
          uVar12 = uVar21;
          do {
            iVar8 = uVar12 - iVar18;
            uVar12 = uVar12 - iVar18;
            pHVar19[(ulong)bVar4 + (long)iVar8] = (HuffmanCode)(uVar17 << 0x10 | uVar16 & 0xff);
          } while (0 < (int)uVar12);
          lVar11 = lVar11 + local_50;
          puVar2 = count + lVar1;
          *puVar2 = *puVar2 - 1;
        } while (*puVar2 != 0);
      }
      iVar18 = iVar18 * 2;
      local_50 = local_50 >> 1;
      local_6c = local_6c + 1;
      lVar14 = lVar1;
    } while (lVar1 < iVar15);
  }
  return local_70;
}

Assistant:

uint32_t BrotliBuildHuffmanTable(HuffmanCode* root_table,
                                 int root_bits,
                                 const uint16_t* const symbol_lists,
                                 uint16_t* count) {
  HuffmanCode code;       /* current table entry */
  HuffmanCode* table;     /* next available space in table */
  int len;                /* current code length */
  int symbol;             /* symbol index in original or sorted table */
  brotli_reg_t key;       /* prefix code */
  brotli_reg_t key_step;  /* prefix code addend */
  brotli_reg_t sub_key;   /* 2nd level table prefix code */
  brotli_reg_t sub_key_step;  /* 2nd level table prefix code addend */
  int step;               /* step size to replicate values in current table */
  int table_bits;         /* key length of current table */
  int table_size;         /* size of current table */
  int total_size;         /* sum of root table size and 2nd level table sizes */
  int max_length = -1;
  int bits;
  int bits_count;

  BROTLI_DCHECK(root_bits <= BROTLI_REVERSE_BITS_MAX);
  BROTLI_DCHECK(BROTLI_HUFFMAN_MAX_CODE_LENGTH - root_bits <=
                BROTLI_REVERSE_BITS_MAX);

  while (symbol_lists[max_length] == 0xFFFF) max_length--;
  max_length += BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1;

  table = root_table;
  table_bits = root_bits;
  table_size = 1 << table_bits;
  total_size = table_size;

  /* Fill in the root table. Reduce the table size to if possible,
     and create the repetitions by memcpy. */
  if (table_bits > max_length) {
    table_bits = max_length;
    table_size = 1 << table_bits;
  }
  key = 0;
  key_step = BROTLI_REVERSE_BITS_LOWEST;
  bits = 1;
  step = 2;
  do {
    symbol = bits - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
    for (bits_count = count[bits]; bits_count != 0; --bits_count) {
      symbol = symbol_lists[symbol];
      code = ConstructHuffmanCode((uint8_t)bits, (uint16_t)symbol);
      ReplicateValue(&table[BrotliReverseBits(key)], step, table_size, code);
      key += key_step;
    }
    step <<= 1;
    key_step >>= 1;
  } while (++bits <= table_bits);

  /* If root_bits != table_bits then replicate to fill the remaining slots. */
  while (total_size != table_size) {
    memcpy(&table[table_size], &table[0],
           (size_t)table_size * sizeof(table[0]));
    table_size <<= 1;
  }

  /* Fill in 2nd level tables and add pointers to root table. */
  key_step = BROTLI_REVERSE_BITS_LOWEST >> (root_bits - 1);
  sub_key = (BROTLI_REVERSE_BITS_LOWEST << 1);
  sub_key_step = BROTLI_REVERSE_BITS_LOWEST;
  for (len = root_bits + 1, step = 2; len <= max_length; ++len) {
    symbol = len - (BROTLI_HUFFMAN_MAX_CODE_LENGTH + 1);
    for (; count[len] != 0; --count[len]) {
      if (sub_key == (BROTLI_REVERSE_BITS_LOWEST << 1U)) {
        table += table_size;
        table_bits = NextTableBitSize(count, len, root_bits);
        table_size = 1 << table_bits;
        total_size += table_size;
        sub_key = BrotliReverseBits(key);
        key += key_step;
        root_table[sub_key] = ConstructHuffmanCode(
            (uint8_t)(table_bits + root_bits),
            (uint16_t)(((size_t)(table - root_table)) - sub_key));
        sub_key = 0;
      }
      symbol = symbol_lists[symbol];
      code = ConstructHuffmanCode((uint8_t)(len - root_bits), (uint16_t)symbol);
      ReplicateValue(
          &table[BrotliReverseBits(sub_key)], step, table_size, code);
      sub_key += sub_key_step;
    }
    step <<= 1;
    sub_key_step >>= 1;
  }
  return (uint32_t)total_size;
}